

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O1

void sb_bmp_set(uint8_t *bmp,bid_t bid,uint64_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar56;
  int iVar59;
  int iVar60;
  undefined1 auVar57 [16];
  int iVar61;
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar75;
  int iVar79;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  
  uVar32 = (ulong)((uint)bid & 7);
  uVar35 = 8 - uVar32;
  if (uVar35 < len) {
    uVar34 = (ulong)((uint)(len + bid) & 7);
    uVar30 = uVar35 + bid;
    uVar31 = ((bid | 0xfffffffffffffff8) + len) - uVar34;
    uVar33 = len + bid >> 3;
    len = uVar35;
  }
  else {
    uVar33 = 0;
    uVar34 = 0;
    uVar30 = 0;
    uVar31 = 0;
  }
  if (len != 0) {
    bmp[bid >> 3] = bmp[bid >> 3] | bmp_2d_mask[uVar32][len];
  }
  if (uVar34 != 0) {
    bmp[uVar33] = bmp[uVar33] | bmp_2d_mask[0][uVar34];
  }
  auVar29 = _DAT_001534f0;
  auVar28 = _DAT_001534e0;
  auVar27 = _DAT_001534d0;
  auVar26 = _DAT_001534c0;
  auVar25 = _DAT_001534b0;
  auVar24 = _DAT_0014f4b0;
  auVar23 = _DAT_0014f4a0;
  if (uVar31 == 8) {
    bmp[uVar30 >> 3] = 0xff;
  }
  else {
    if (0x3f < uVar31) {
      memset(bmp + (uVar30 >> 3),0xff,uVar31 >> 3);
      return;
    }
    if (uVar31 != 0) {
      uVar31 = uVar31 - 1;
      auVar57._8_4_ = (int)uVar31;
      auVar57._0_8_ = uVar31;
      auVar57._12_4_ = (int)(uVar31 >> 0x20);
      auVar36._0_8_ = uVar31 >> 3;
      auVar36._8_8_ = auVar57._8_8_ >> 3;
      uVar32 = 0;
      do {
        auVar54._8_4_ = (int)uVar32;
        auVar54._0_8_ = uVar32;
        auVar54._12_4_ = (int)(uVar32 >> 0x20);
        auVar57 = auVar36 ^ auVar24;
        auVar62 = (auVar54 | auVar23) ^ auVar24;
        iVar56 = auVar57._0_4_;
        iVar75 = -(uint)(iVar56 < auVar62._0_4_);
        iVar59 = auVar57._4_4_;
        auVar64._4_4_ = -(uint)(iVar59 < auVar62._4_4_);
        iVar60 = auVar57._8_4_;
        iVar79 = -(uint)(iVar60 < auVar62._8_4_);
        iVar61 = auVar57._12_4_;
        auVar64._12_4_ = -(uint)(iVar61 < auVar62._12_4_);
        auVar37._4_4_ = iVar75;
        auVar37._0_4_ = iVar75;
        auVar37._8_4_ = iVar79;
        auVar37._12_4_ = iVar79;
        auVar57 = pshuflw(in_XMM1,auVar37,0xe8);
        auVar63._4_4_ = -(uint)(auVar62._4_4_ == iVar59);
        auVar63._12_4_ = -(uint)(auVar62._12_4_ == iVar61);
        auVar63._0_4_ = auVar63._4_4_;
        auVar63._8_4_ = auVar63._12_4_;
        auVar46 = pshuflw(in_XMM2,auVar63,0xe8);
        auVar64._0_4_ = auVar64._4_4_;
        auVar64._8_4_ = auVar64._12_4_;
        auVar37 = pshuflw(auVar57,auVar64,0xe8);
        auVar62._8_4_ = 0xffffffff;
        auVar62._0_8_ = 0xffffffffffffffff;
        auVar62._12_4_ = 0xffffffff;
        auVar62 = (auVar37 | auVar46 & auVar57) ^ auVar62;
        auVar57 = packssdw(auVar62,auVar62);
        if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bmp[uVar32 + (uVar30 >> 3)] = 0xff;
        }
        auVar10._4_4_ = iVar75;
        auVar10._0_4_ = iVar75;
        auVar10._8_4_ = iVar79;
        auVar10._12_4_ = iVar79;
        auVar64 = auVar63 & auVar10 | auVar64;
        auVar57 = packssdw(auVar64,auVar64);
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57 ^ auVar46,auVar57 ^ auVar46);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57._0_4_ >> 8 & 1) != 0) {
          bmp[uVar32 + (uVar30 + 8 >> 3)] = 0xff;
        }
        auVar57 = (auVar54 | auVar29) ^ auVar24;
        auVar47._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
        auVar47._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
        auVar47._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
        auVar47._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
        auVar65._4_4_ = auVar47._0_4_;
        auVar65._0_4_ = auVar47._0_4_;
        auVar65._8_4_ = auVar47._8_4_;
        auVar65._12_4_ = auVar47._8_4_;
        iVar75 = -(uint)(auVar57._4_4_ == iVar59);
        iVar79 = -(uint)(auVar57._12_4_ == iVar61);
        auVar11._4_4_ = iVar75;
        auVar11._0_4_ = iVar75;
        auVar11._8_4_ = iVar79;
        auVar11._12_4_ = iVar79;
        auVar76._4_4_ = auVar47._4_4_;
        auVar76._0_4_ = auVar47._4_4_;
        auVar76._8_4_ = auVar47._12_4_;
        auVar76._12_4_ = auVar47._12_4_;
        auVar57 = auVar11 & auVar65 | auVar76;
        auVar57 = packssdw(auVar57,auVar57);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57 ^ auVar1,auVar57 ^ auVar1);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57._0_4_ >> 0x10 & 1) != 0) {
          bmp[uVar32 + (uVar30 + 0x10 >> 3)] = 0xff;
        }
        auVar57 = pshufhw(auVar57,auVar65,0x84);
        auVar12._4_4_ = iVar75;
        auVar12._0_4_ = iVar75;
        auVar12._8_4_ = iVar79;
        auVar12._12_4_ = iVar79;
        auVar37 = pshufhw(auVar47,auVar12,0x84);
        auVar62 = pshufhw(auVar57,auVar76,0x84);
        auVar38._8_4_ = 0xffffffff;
        auVar38._0_8_ = 0xffffffffffffffff;
        auVar38._12_4_ = 0xffffffff;
        auVar38 = (auVar62 | auVar37 & auVar57) ^ auVar38;
        auVar57 = packssdw(auVar38,auVar38);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57._0_4_ >> 0x18 & 1) != 0) {
          bmp[uVar32 + (uVar30 + 0x18 >> 3)] = 0xff;
        }
        auVar57 = (auVar54 | auVar28) ^ auVar24;
        auVar48._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
        auVar48._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
        auVar48._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
        auVar48._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
        auVar13._4_4_ = auVar48._0_4_;
        auVar13._0_4_ = auVar48._0_4_;
        auVar13._8_4_ = auVar48._8_4_;
        auVar13._12_4_ = auVar48._8_4_;
        auVar37 = pshuflw(auVar76,auVar13,0xe8);
        auVar39._0_4_ = -(uint)(auVar57._0_4_ == iVar56);
        auVar39._4_4_ = -(uint)(auVar57._4_4_ == iVar59);
        auVar39._8_4_ = -(uint)(auVar57._8_4_ == iVar60);
        auVar39._12_4_ = -(uint)(auVar57._12_4_ == iVar61);
        auVar66._4_4_ = auVar39._4_4_;
        auVar66._0_4_ = auVar39._4_4_;
        auVar66._8_4_ = auVar39._12_4_;
        auVar66._12_4_ = auVar39._12_4_;
        auVar57 = pshuflw(auVar39,auVar66,0xe8);
        auVar67._4_4_ = auVar48._4_4_;
        auVar67._0_4_ = auVar48._4_4_;
        auVar67._8_4_ = auVar48._12_4_;
        auVar67._12_4_ = auVar48._12_4_;
        auVar62 = pshuflw(auVar48,auVar67,0xe8);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57 & auVar37,(auVar62 | auVar57 & auVar37) ^ auVar2);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          bmp[uVar32 + (uVar30 + 0x20 >> 3)] = 0xff;
        }
        auVar14._4_4_ = auVar48._0_4_;
        auVar14._0_4_ = auVar48._0_4_;
        auVar14._8_4_ = auVar48._8_4_;
        auVar14._12_4_ = auVar48._8_4_;
        auVar67 = auVar66 & auVar14 | auVar67;
        auVar62 = packssdw(auVar67,auVar67);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57,auVar62 ^ auVar3);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57._4_2_ >> 8 & 1) != 0) {
          bmp[uVar32 + (uVar30 + 0x28 >> 3)] = 0xff;
        }
        auVar57 = (auVar54 | auVar27) ^ auVar24;
        auVar49._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
        auVar49._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
        auVar49._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
        auVar49._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
        auVar68._4_4_ = auVar49._0_4_;
        auVar68._0_4_ = auVar49._0_4_;
        auVar68._8_4_ = auVar49._8_4_;
        auVar68._12_4_ = auVar49._8_4_;
        iVar75 = -(uint)(auVar57._4_4_ == iVar59);
        iVar79 = -(uint)(auVar57._12_4_ == iVar61);
        auVar15._4_4_ = iVar75;
        auVar15._0_4_ = iVar75;
        auVar15._8_4_ = iVar79;
        auVar15._12_4_ = iVar79;
        auVar77._4_4_ = auVar49._4_4_;
        auVar77._0_4_ = auVar49._4_4_;
        auVar77._8_4_ = auVar49._12_4_;
        auVar77._12_4_ = auVar49._12_4_;
        auVar57 = auVar15 & auVar68 | auVar77;
        auVar57 = packssdw(auVar57,auVar57);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57 ^ auVar4,auVar57 ^ auVar4);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          bmp[uVar32 + (uVar30 + 0x30 >> 3)] = 0xff;
        }
        auVar57 = pshufhw(auVar57,auVar68,0x84);
        auVar16._4_4_ = iVar75;
        auVar16._0_4_ = iVar75;
        auVar16._8_4_ = iVar79;
        auVar16._12_4_ = iVar79;
        auVar37 = pshufhw(auVar49,auVar16,0x84);
        auVar62 = pshufhw(auVar57,auVar77,0x84);
        auVar40._8_4_ = 0xffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar40._12_4_ = 0xffffffff;
        auVar40 = (auVar62 | auVar37 & auVar57) ^ auVar40;
        auVar57 = packssdw(auVar40,auVar40);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57._6_2_ >> 8 & 1) != 0) {
          bmp[uVar32 + (uVar30 + 0x38 >> 3)] = 0xff;
        }
        auVar57 = (auVar54 | auVar26) ^ auVar24;
        auVar50._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
        auVar50._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
        auVar50._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
        auVar50._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
        auVar17._4_4_ = auVar50._0_4_;
        auVar17._0_4_ = auVar50._0_4_;
        auVar17._8_4_ = auVar50._8_4_;
        auVar17._12_4_ = auVar50._8_4_;
        auVar37 = pshuflw(auVar77,auVar17,0xe8);
        auVar41._0_4_ = -(uint)(auVar57._0_4_ == iVar56);
        auVar41._4_4_ = -(uint)(auVar57._4_4_ == iVar59);
        auVar41._8_4_ = -(uint)(auVar57._8_4_ == iVar60);
        auVar41._12_4_ = -(uint)(auVar57._12_4_ == iVar61);
        auVar69._4_4_ = auVar41._4_4_;
        auVar69._0_4_ = auVar41._4_4_;
        auVar69._8_4_ = auVar41._12_4_;
        auVar69._12_4_ = auVar41._12_4_;
        auVar57 = pshuflw(auVar41,auVar69,0xe8);
        auVar70._4_4_ = auVar50._4_4_;
        auVar70._0_4_ = auVar50._4_4_;
        auVar70._8_4_ = auVar50._12_4_;
        auVar70._12_4_ = auVar50._12_4_;
        auVar62 = pshuflw(auVar50,auVar70,0xe8);
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar51 = (auVar62 | auVar57 & auVar37) ^ auVar51;
        auVar62 = packssdw(auVar51,auVar51);
        auVar57 = packsswb(auVar57 & auVar37,auVar62);
        if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          bmp[uVar32 + (uVar30 + 0x40 >> 3)] = 0xff;
        }
        auVar18._4_4_ = auVar50._0_4_;
        auVar18._0_4_ = auVar50._0_4_;
        auVar18._8_4_ = auVar50._8_4_;
        auVar18._12_4_ = auVar50._8_4_;
        auVar70 = auVar69 & auVar18 | auVar70;
        auVar62 = packssdw(auVar70,auVar70);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar62 = packssdw(auVar62 ^ auVar5,auVar62 ^ auVar5);
        auVar57 = packsswb(auVar57,auVar62);
        if ((auVar57._8_2_ >> 8 & 1) != 0) {
          bmp[uVar32 + (uVar30 + 0x48 >> 3)] = 0xff;
        }
        auVar57 = (auVar54 | auVar25) ^ auVar24;
        auVar52._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
        auVar52._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
        auVar52._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
        auVar52._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
        auVar71._4_4_ = auVar52._0_4_;
        auVar71._0_4_ = auVar52._0_4_;
        auVar71._8_4_ = auVar52._8_4_;
        auVar71._12_4_ = auVar52._8_4_;
        iVar75 = -(uint)(auVar57._4_4_ == iVar59);
        iVar79 = -(uint)(auVar57._12_4_ == iVar61);
        auVar19._4_4_ = iVar75;
        auVar19._0_4_ = iVar75;
        auVar19._8_4_ = iVar79;
        auVar19._12_4_ = iVar79;
        auVar78._4_4_ = auVar52._4_4_;
        auVar78._0_4_ = auVar52._4_4_;
        auVar78._8_4_ = auVar52._12_4_;
        auVar78._12_4_ = auVar52._12_4_;
        auVar57 = auVar19 & auVar71 | auVar78;
        auVar57 = packssdw(auVar57,auVar57);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57 ^ auVar6,auVar57 ^ auVar6);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          bmp[uVar32 + (uVar30 + 0x50 >> 3)] = 0xff;
        }
        auVar57 = pshufhw(auVar57,auVar71,0x84);
        auVar20._4_4_ = iVar75;
        auVar20._0_4_ = iVar75;
        auVar20._8_4_ = iVar79;
        auVar20._12_4_ = iVar79;
        auVar37 = pshufhw(auVar52,auVar20,0x84);
        auVar62 = pshufhw(auVar57,auVar78,0x84);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar42 = (auVar62 | auVar37 & auVar57) ^ auVar42;
        auVar57 = packssdw(auVar42,auVar42);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57._10_2_ >> 8 & 1) != 0) {
          bmp[uVar32 + (uVar30 + 0x58 >> 3)] = 0xff;
        }
        auVar57 = (auVar54 | _DAT_001534a0) ^ auVar24;
        auVar53._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
        auVar53._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
        auVar53._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
        auVar53._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
        auVar21._4_4_ = auVar53._0_4_;
        auVar21._0_4_ = auVar53._0_4_;
        auVar21._8_4_ = auVar53._8_4_;
        auVar21._12_4_ = auVar53._8_4_;
        auVar37 = pshuflw(auVar78,auVar21,0xe8);
        auVar43._0_4_ = -(uint)(auVar57._0_4_ == iVar56);
        auVar43._4_4_ = -(uint)(auVar57._4_4_ == iVar59);
        auVar43._8_4_ = -(uint)(auVar57._8_4_ == iVar60);
        auVar43._12_4_ = -(uint)(auVar57._12_4_ == iVar61);
        auVar72._4_4_ = auVar43._4_4_;
        auVar72._0_4_ = auVar43._4_4_;
        auVar72._8_4_ = auVar43._12_4_;
        auVar72._12_4_ = auVar43._12_4_;
        auVar57 = pshuflw(auVar43,auVar72,0xe8);
        auVar73._4_4_ = auVar53._4_4_;
        auVar73._0_4_ = auVar53._4_4_;
        auVar73._8_4_ = auVar53._12_4_;
        auVar73._12_4_ = auVar53._12_4_;
        auVar62 = pshuflw(auVar53,auVar73,0xe8);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57 & auVar37,(auVar62 | auVar57 & auVar37) ^ auVar7);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          bmp[uVar32 + (uVar30 + 0x60 >> 3)] = 0xff;
        }
        auVar22._4_4_ = auVar53._0_4_;
        auVar22._0_4_ = auVar53._0_4_;
        auVar22._8_4_ = auVar53._8_4_;
        auVar22._12_4_ = auVar53._8_4_;
        auVar73 = auVar72 & auVar22 | auVar73;
        auVar62 = packssdw(auVar73,auVar73);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57,auVar62 ^ auVar8);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57._12_2_ >> 8 & 1) != 0) {
          bmp[uVar32 + (uVar30 + 0x68 >> 3)] = 0xff;
        }
        auVar57 = (auVar54 | _DAT_00153490) ^ auVar24;
        auVar44._0_4_ = -(uint)(iVar56 < auVar57._0_4_);
        auVar44._4_4_ = -(uint)(iVar59 < auVar57._4_4_);
        auVar44._8_4_ = -(uint)(iVar60 < auVar57._8_4_);
        auVar44._12_4_ = -(uint)(iVar61 < auVar57._12_4_);
        auVar74._4_4_ = auVar44._0_4_;
        auVar74._0_4_ = auVar44._0_4_;
        auVar74._8_4_ = auVar44._8_4_;
        auVar74._12_4_ = auVar44._8_4_;
        auVar55._4_4_ = -(uint)(auVar57._4_4_ == iVar59);
        auVar55._12_4_ = -(uint)(auVar57._12_4_ == iVar61);
        auVar55._0_4_ = auVar55._4_4_;
        auVar55._8_4_ = auVar55._12_4_;
        auVar58._4_4_ = auVar44._4_4_;
        auVar58._0_4_ = auVar44._4_4_;
        auVar58._8_4_ = auVar44._12_4_;
        auVar58._12_4_ = auVar44._12_4_;
        auVar62 = auVar55 & auVar74 | auVar58;
        auVar57 = packssdw(auVar44,auVar62);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar57 = packssdw(auVar57 ^ auVar9,auVar57 ^ auVar9);
        auVar57 = packsswb(auVar57,auVar57);
        if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          bmp[uVar32 + (uVar30 + 0x70 >> 3)] = 0xff;
        }
        auVar57 = pshufhw(auVar57,auVar74,0x84);
        auVar62 = pshufhw(auVar62,auVar55,0x84);
        in_XMM2 = auVar62 & auVar57;
        auVar57 = pshufhw(auVar57,auVar58,0x84);
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar45 = (auVar57 | in_XMM2) ^ auVar45;
        auVar57 = packssdw(auVar45,auVar45);
        in_XMM1 = packsswb(auVar57,auVar57);
        if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
          bmp[uVar32 + (uVar30 + 0x78 >> 3)] = 0xff;
        }
        uVar32 = uVar32 + 0x10;
      } while (((uVar31 >> 3) + 0x10 & 0xfffffffffffffff0) != uVar32);
    }
  }
  return;
}

Assistant:

void sb_bmp_set(uint8_t *bmp, bid_t bid, uint64_t len)
{
    _sb_bmp_update(bmp, bid, len, 1);
}